

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O1

bool __thiscall
kws::Parser::IsBetweenCharsFast
          (Parser *this,char begin,char end,size_t pos,bool withComments,string *buffer)

{
  pointer pcVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  string stream;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_50[0] = local_40;
  pcVar1 = (buffer->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + buffer->_M_string_length);
  if ((buffer->_M_string_length == 0) &&
     (std::__cxx11::string::_M_assign((string *)local_50), withComments)) {
    std::__cxx11::string::_M_assign((string *)local_50);
  }
  if (pos == 0xffffffffffffffff) {
    bVar2 = false;
  }
  else {
    bVar2 = false;
    uVar3 = std::__cxx11::string::find((char)local_50,(ulong)(uint)(int)begin);
    uVar4 = std::__cxx11::string::find((char)local_50,(ulong)(uint)(int)end);
    if (uVar3 < uVar4 && uVar4 != 0xffffffffffffffff) {
      while (bVar2 = pos < uVar4 && uVar3 < pos, pos >= uVar4 || uVar3 >= pos) {
        uVar3 = std::__cxx11::string::find((char)local_50,(ulong)(uint)(int)begin);
        uVar4 = std::__cxx11::string::find((char)local_50,(ulong)(uint)(int)end);
        if ((uVar4 <= uVar3) || (uVar4 == 0xffffffffffffffff)) break;
      }
    }
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return bVar2;
}

Assistant:

bool Parser::IsBetweenCharsFast(const char begin, const char end ,size_t pos,bool withComments,std::string buffer) const
{
  std::string stream = buffer;
  if (buffer.empty()) {
    stream = m_BufferNoComment;
    if(withComments)
      {
      stream = m_Buffer;
      }
  }

  if(pos == std::string::npos)
    {
    return false;
    }

  size_t b0 = stream.find(begin,0);
  size_t b1 = stream.find(end,b0);

  while(b0 != std::string::npos && b1 != std::string::npos && b1>b0)
    {
    if(pos>b0 && pos<b1)
      {
      return true;
      }
    b0 = stream.find(begin,b0+1);
    b1 = stream.find(end,b0);
    }
  return false;
}